

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_NetworkAdapter.cpp
# Opt level: O3

char * axl::io::getNetworkAdapterTypeString(NetworkAdapterType adapterKind)

{
  if (adapterKind < NetworkAdapterType__Count) {
    return _ZZN3axl2io27getNetworkAdapterTypeStringENS0_18NetworkAdapterTypeEE11stringTable_rel +
           *(int *)(
                   _ZZN3axl2io27getNetworkAdapterTypeStringENS0_18NetworkAdapterTypeEE11stringTable_rel
                   + (ulong)adapterKind * 4);
  }
  return "unknown-adapter-kind";
}

Assistant:

const char*
getNetworkAdapterTypeString(NetworkAdapterType adapterKind) {
	static const char* stringTable[NetworkAdapterType__Count] = {
		"unknown-adapter-kind", // NetworkAdapterType_Unknown,
		"loopback",             // NetworkAdapterType_Loopback,
		"ethernet",             // NetworkAdapterType_Ethernet,
		"wireless",             // NetworkAdapterType_Wireless,
		"PPP",                  // NetworkAdapterType_Ppp,
		"token ring",           // NetworkAdapterType_TokenRing,
		"slip",                 // NetworkAdapterType_Slip,
		"tunnel",               // NetworkAdapterType_Tunnel,
	};

	return (size_t)adapterKind < countof(stringTable) ?
		stringTable[adapterKind] :
		stringTable[NetworkAdapterType_Unknown];
}